

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::TestSuite::TestSuite
          (TestSuite *this,char *a_name,char *a_type_param,SetUpTestSuiteFunc set_up_tc,
          TearDownTestSuiteFunc tear_down_tc)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_3a;
  allocator<char> local_39;
  string *local_38;
  
  this->_vptr_TestSuite = (_func_int **)&PTR__TestSuite_0013ee88;
  local_38 = &this->name_;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,a_name,&local_39);
  if (a_type_param == (char *)0x0) {
    (this->type_param_)._M_t.
    super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              operator_new(0x20);
    std::__cxx11::string::string<std::allocator<char>>((string *)this_00,a_type_param,&local_3a);
    (this->type_param_)._M_t.
    super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl = this_00;
  }
  (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->test_info_list_).
  super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->test_info_list_).
  super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->test_info_list_).
  super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->set_up_tc_ = set_up_tc;
  this->tear_down_tc_ = tear_down_tc;
  this->should_run_ = false;
  this->start_timestamp_ = 0;
  this->elapsed_time_ = 0;
  TestResult::TestResult(&this->ad_hoc_test_result_);
  return;
}

Assistant:

TestSuite::TestSuite(const char* a_name, const char* a_type_param,
                     internal::SetUpTestSuiteFunc set_up_tc,
                     internal::TearDownTestSuiteFunc tear_down_tc)
    : name_(a_name),
      type_param_(a_type_param ? new std::string(a_type_param) : nullptr),
      set_up_tc_(set_up_tc),
      tear_down_tc_(tear_down_tc),
      should_run_(false),
      start_timestamp_(0),
      elapsed_time_(0) {}